

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

void cf_h2_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  Curl_easy *pCVar1;
  int32_t iVar2;
  int iVar3;
  bool bVar4;
  bool local_55;
  _Bool local_54;
  byte local_53;
  byte local_52;
  int *local_50;
  _Bool s_exhaust;
  _Bool c_exhaust;
  cf_call_data save;
  stream_ctx *stream;
  _Bool want_send;
  _Bool want_recv;
  long *plStack_28;
  curl_socket_t sock;
  cf_h2_ctx *ctx;
  easy_pollset *ps_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  plStack_28 = (long *)cf->ctx;
  if (*plStack_28 != 0) {
    ctx = (cf_h2_ctx *)ps;
    ps_local = (easy_pollset *)data;
    data_local = (Curl_easy *)cf;
    stream._4_4_ = Curl_conn_cf_get_socket(cf,data);
    Curl_pollset_check((Curl_easy *)ps_local,(easy_pollset *)ctx,stream._4_4_,
                       (_Bool *)((long)&stream + 3),(_Bool *)((long)&stream + 2));
    if (((stream._3_1_ & 1) != 0) || ((stream._2_1_ & 1) != 0)) {
      if ((ps_local == (easy_pollset *)0x0) || (*(long *)ps_local[0xc].sockets == 0)) {
        local_50 = (int *)0x0;
      }
      else {
        local_50 = *(int **)(*(long *)ps_local[0xc].sockets + 0x40);
      }
      pCVar1 = data_local->next->next;
      data_local->next->next = (Curl_easy *)ps_local;
      bVar4 = false;
      if ((stream._2_1_ & 1) != 0) {
        iVar2 = nghttp2_session_get_remote_window_size((nghttp2_session *)*plStack_28);
        bVar4 = iVar2 == 0;
      }
      local_52 = 0;
      if ((((stream._2_1_ & 1) != 0) && (local_52 = 0, local_50 != (int *)0x0)) &&
         (local_52 = 0, -1 < *local_50)) {
        iVar2 = nghttp2_session_get_stream_remote_window_size
                          ((nghttp2_session *)*plStack_28,*local_50);
        local_52 = iVar2 != 0 ^ 0xff;
      }
      local_53 = 1;
      if (((stream._3_1_ & 1) == 0) && (local_53 = 1, !bVar4)) {
        local_53 = local_52 & 1;
      }
      stream._3_1_ = local_53;
      if (((local_52 & 1) != 0) || (local_54 = true, (stream._2_1_ & 1) == 0)) {
        local_55 = false;
        if (!bVar4) {
          iVar3 = nghttp2_session_want_write((nghttp2_session *)*plStack_28);
          local_55 = iVar3 != 0;
        }
        local_54 = local_55;
      }
      stream._2_1_ = local_54;
      Curl_pollset_set((Curl_easy *)ps_local,(easy_pollset *)ctx,stream._4_4_,
                       (_Bool)(stream._3_1_ & 1),local_54);
      data_local->next->next = pCVar1;
    }
  }
  return;
}

Assistant:

static void cf_h2_adjust_pollset(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 struct easy_pollset *ps)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  curl_socket_t sock;
  bool want_recv, want_send;

  if(!ctx->h2)
    return;

  sock = Curl_conn_cf_get_socket(cf, data);
  Curl_pollset_check(data, ps, sock, &want_recv, &want_send);
  if(want_recv || want_send) {
    struct stream_ctx *stream = H2_STREAM_CTX(data);
    struct cf_call_data save;
    bool c_exhaust, s_exhaust;

    CF_DATA_SAVE(save, cf, data);
    c_exhaust = want_send && !nghttp2_session_get_remote_window_size(ctx->h2);
    s_exhaust = want_send && stream && stream->id >= 0 &&
                !nghttp2_session_get_stream_remote_window_size(ctx->h2,
                                                               stream->id);
    want_recv = (want_recv || c_exhaust || s_exhaust);
    want_send = (!s_exhaust && want_send) ||
                (!c_exhaust && nghttp2_session_want_write(ctx->h2));

    Curl_pollset_set(data, ps, sock, want_recv, want_send);
    CF_DATA_RESTORE(cf, save);
  }
}